

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O2

void __thiscall avro::ostreambuf::~ostreambuf(ostreambuf *this)

{
  ~ostreambuf(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

class AVRO_DECL ostreambuf : public std::streambuf {

  public:

    /// Default constructor creates a new OutputBuffer.
    ostreambuf() : 
        std::streambuf(),
        buffer_()
    { }

    /// Construct using an existing OutputBuffer.
    explicit ostreambuf(OutputBuffer &buffer) :
        std::streambuf(),
        buffer_( buffer )
    { }

    /// Return the buffer.
    const OutputBuffer &getBuffer() const {
        return buffer_;
    }

  protected:
    
    /// Write a single character to the stream.
    virtual int_type overflow(int_type c) 
    {
        buffer_.writeTo(static_cast<OutputBuffer::data_type>(c));
        return c;
    }